

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,ListEditQual v)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "append";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "add";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "delete";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "prepend";
    paVar1 = &local_d;
    break;
  case 5:
    pcVar2 = "order";
    paVar1 = &local_e;
    break;
  default:
    pcVar2 = "[[Invalid ListEditQual value]]";
    paVar1 = &local_f;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::ListEditQual v) {
  if (v == tinyusdz::ListEditQual::ResetToExplicit) {
    return "";  // unqualified
  } else if (v == tinyusdz::ListEditQual::Append) {
    return "append";
  } else if (v == tinyusdz::ListEditQual::Add) {
    return "add";
  } else if (v == tinyusdz::ListEditQual::Delete) {
    return "delete";
  } else if (v == tinyusdz::ListEditQual::Prepend) {
    return "prepend";
  } else if (v == tinyusdz::ListEditQual::Order) {
    return "order";
  }

  return "[[Invalid ListEditQual value]]";
}